

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::AddToActive(LinearScan *this,Lifetime *lifetime)

{
  RegNum RVar1;
  code *pcVar2;
  BOOLEAN BVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  AddLiveRange(this->activeLiveranges,lifetime);
  RVar1 = lifetime->reg;
  this->regContent[RVar1] = lifetime;
  if ((lifetime->field_0x9d & 2) != 0) {
    BVUnitT<unsigned_long>::Set(&this->secondChanceRegs,(uint)RVar1);
    return;
  }
  BVar3 = BVUnitT<unsigned_long>::Test(&this->secondChanceRegs,(uint)RVar1);
  if (BVar3 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x2bf,"(!this->secondChanceRegs.Test(lifetime->reg))",
                       "!this->secondChanceRegs.Test(lifetime->reg)");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void
LinearScan::AddToActive(Lifetime * lifetime)
{
    LinearScan::AddLiveRange(this->activeLiveranges, lifetime);
    this->regContent[lifetime->reg] = lifetime;
    if (lifetime->isSecondChanceAllocated)
    {
        this->secondChanceRegs.Set(lifetime->reg);
    }
    else
    {
        Assert(!this->secondChanceRegs.Test(lifetime->reg));
    }
}